

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void a_ensure_(void *v,int delta,int sz)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__dest;
  int iVar4;
  
  iVar1 = *(int *)((long)v + 4);
  iVar2 = -iVar1;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  iVar4 = delta + *v;
  if (iVar2 < iVar4) {
    iVar3 = iVar2 * 2;
    if (iVar4 != iVar3 && SBORROW4(iVar4,iVar3) == iVar4 + iVar2 * -2 < 0) {
      iVar3 = iVar4;
    }
    if (iVar1 < 1) {
      __dest = malloc((long)(iVar3 * sz));
      memcpy(__dest,*(void **)((long)v + 8),(long)(iVar2 * sz));
    }
    else {
      __dest = realloc(*(void **)((long)v + 8),(long)(iVar3 * sz));
    }
    memset((void *)((long)(iVar2 * sz) + (long)__dest),0,(long)((iVar3 - iVar2) * sz));
    *(void **)((long)v + 8) = __dest;
    *(int *)((long)v + 4) = iVar3;
  }
  return;
}

Assistant:

void a_ensure_ (void *v, int delta, int sz) {
	typedef A_TYPE (void *) a_void_ptr;
	a_void_ptr *a = (a_void_ptr *) v;
	int omax = a->h_.max_;
	if (omax < 0) {
		omax = -omax;
	}
	if (a->h_.len_ + delta > omax) {
		int nmax = a->h_.len_ + delta;
		void *na;
		if (nmax < omax * 2) {
			nmax = omax * 2;
		}
		if (a->h_.max_ <= 0) {
			na = malloc (nmax * sz);
			memcpy (na, a->a_, omax*sz);
		} else {
			na = realloc (a->a_, nmax*sz);
		}
		memset (omax *sz + (char *)na, 0, (nmax - omax) * sz);
		a->a_ = (void **) na;
		a->h_.max_ = nmax;
	}
}